

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O3

ostream * MinVR::operator<<(ostream *os,VRDatumPtr *p)

{
  ostream *poVar1;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  (*p->pData->_vptr_VRDatum[2])(&local_30);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return poVar1;
}

Assistant:

std::ostream & operator<<(std::ostream &os, VRDatumPtr& p) {
  return os << p->getValueString();
}